

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
::LookupBucketFor<llvm::StringRef>
          (DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
           *this,StringRef *Val,DenseSetPair<llvm::StringRef> **FoundBucket)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  StringRef *pSVar8;
  StringRef RHS;
  StringRef *local_40;
  
  iVar1 = *(int *)(this + 0x10);
  if (iVar1 == 0) {
    pSVar8 = (StringRef *)0x0;
LAB_0015863b:
    bVar4 = false;
  }
  else {
    lVar2 = *(long *)this;
    bVar3 = DenseMapInfo<llvm::StringRef>::isEqual(*Val,(StringRef)ZEXT816(0xffffffffffffffff));
    if ((bVar3) ||
       (bVar3 = DenseMapInfo<llvm::StringRef>::isEqual(*Val,(StringRef)ZEXT816(0xfffffffffffffffe)),
       bVar3)) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, KeyT = llvm::StringRef, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<StringRef>, BucketT = llvm::detail::DenseSetPair<llvm::StringRef>, LookupKeyT = llvm::StringRef]"
                   );
    }
    uVar5 = getHashValue(Val);
    iVar6 = 1;
    local_40 = (StringRef *)0x0;
    while( true ) {
      uVar5 = uVar5 & iVar1 - 1U;
      lVar7 = (ulong)uVar5 * 0x10;
      pSVar8 = (StringRef *)(lVar2 + lVar7);
      RHS.Length = *(size_t *)(lVar2 + 8 + lVar7);
      RHS.Data = *(char **)(lVar2 + lVar7);
      bVar3 = DenseMapInfo<llvm::StringRef>::isEqual(*Val,RHS);
      bVar4 = true;
      if (bVar3) break;
      bVar3 = DenseMapInfo<llvm::StringRef>::isEqual(*pSVar8,(StringRef)ZEXT816(0xffffffffffffffff))
      ;
      if (bVar3) {
        if (local_40 != (StringRef *)0x0) {
          pSVar8 = local_40;
        }
        goto LAB_0015863b;
      }
      bVar3 = DenseMapInfo<llvm::StringRef>::isEqual(*pSVar8,(StringRef)ZEXT816(0xfffffffffffffffe))
      ;
      if (local_40 != (StringRef *)0x0) {
        pSVar8 = local_40;
      }
      if (bVar3) {
        local_40 = pSVar8;
      }
      uVar5 = uVar5 + iVar6;
      iVar6 = iVar6 + 1;
    }
  }
  *FoundBucket = (DenseSetPair<llvm::StringRef> *)pSVar8;
  return bVar4;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }